

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O0

int Dch_ClassesRefine(Dch_Cla_t *p)

{
  int iVar1;
  int local_20;
  int local_1c;
  int nRefis;
  int i;
  Aig_Obj_t **ppClass;
  Dch_Cla_t *p_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Aig_ManObjNumMax(p->pAig), local_1c < iVar1; local_1c = local_1c + 1) {
    if (p->pId2Class[local_1c] != (Aig_Obj_t **)0x0) {
      iVar1 = Dch_ClassesRefineOneClass(p,*p->pId2Class[local_1c],0);
      local_20 = iVar1 + local_20;
    }
  }
  return local_20;
}

Assistant:

int Dch_ClassesRefine( Dch_Cla_t * p )
{
    Aig_Obj_t ** ppClass;
    int i, nRefis = 0;
    Dch_ManForEachClass( p, ppClass, i )
        nRefis += Dch_ClassesRefineOneClass( p, ppClass[0], 0 );
    return nRefis;
}